

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O2

void __thiscall Runner::HandleParamBlock(Runner *this,ParamBlock *block,bool isConfigs)

{
  ushort uVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  iterator iVar5;
  undefined7 in_register_00000011;
  uint uVar6;
  vector<int,_std::allocator<int>_> *this_00;
  char *pcVar7;
  uint uVar8;
  uint local_48;
  int local_44;
  _Base_ptr local_40;
  set<int,_std::less<int>,_std::allocator<int>_> *local_38;
  ulong __new_size;
  
  uVar3 = block->startIdx << 8 | block->startIdx >> 8;
  uVar4 = (uint)uVar3;
  uVar8 = (ushort)(block->numParams << 8 | block->numParams >> 8) + uVar4;
  __new_size = (ulong)uVar8;
  local_44 = (int)CONCAT71(in_register_00000011,isConfigs);
  if (local_44 == 0) {
    if (__new_size <=
        (ulong)((long)(this->m_CurrStatuses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_CurrStatuses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2)) goto LAB_0011f9a6;
    this_00 = &this->m_CurrStatuses;
  }
  else {
    if (__new_size <=
        (ulong)((long)(this->m_CurrConfigs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_CurrConfigs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2)) goto LAB_0011f9a6;
    this_00 = &this->m_CurrConfigs;
  }
  CLI::std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
LAB_0011f9a6:
  if (s_JSONOutput == true) {
    pcVar7 = "\"status\": {";
    if ((char)local_44 != '\0') {
      pcVar7 = "\"config\": {";
    }
    puts(pcVar7);
  }
  local_38 = &this->m_TemperatureStatusIndices;
  local_40 = &(this->m_TemperatureStatusIndices)._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar2 = false;
  do {
    local_48 = uVar4;
    if ((int)uVar8 <= (int)uVar4) {
      if (s_JSONOutput != false) {
        printf("\n}");
        if ((char)local_44 == '\0') {
          putchar(0x2c);
        }
        putchar(10);
      }
      return;
    }
    uVar1 = block->payload[(int)(uVar4 - uVar3)];
    if (uVar1 != 0x55aa) {
      uVar6 = (uint)(short)(uVar1 << 8 | uVar1 >> 8);
      if ((char)local_44 == '\0') {
        (this->m_CurrStatuses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(int)uVar4] = uVar6;
        if (s_JSONOutput == true) {
          if (bVar2) {
            puts(",");
          }
          printf("\"%d\" : ",(ulong)local_48);
          iVar5 = CLI::std::
                  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                  find(&local_38->_M_t,(key_type *)&local_48);
          if (iVar5._M_node == local_40) {
            printf("%d",(ulong)uVar6);
            goto LAB_0011fb1d;
          }
          bVar2 = true;
          printf("%.1f",(double)((float)(int)uVar6 / 10.0));
        }
        else {
          iVar5 = CLI::std::
                  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                  find(&local_38->_M_t,(key_type *)&local_48);
          if (iVar5._M_node == local_40) {
            pcVar7 = "/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%d}\n";
            goto LAB_0011fb2b;
          }
          printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%.1f}\n",
                 (double)((float)(int)uVar6 / 10.0),(ulong)local_48);
        }
      }
      else {
        (this->m_CurrConfigs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(int)uVar4] = uVar6;
        if (s_JSONOutput == true) {
          if (bVar2) {
            puts(",");
          }
          printf("\"%d\" : %d",(ulong)local_48,(ulong)uVar6);
LAB_0011fb1d:
          bVar2 = true;
        }
        else {
          pcVar7 = "/home/alsavo/config/%d={\"type\":\"config\", \"index\":%d, \"value\":%d}\n";
LAB_0011fb2b:
          printf(pcVar7,(ulong)local_48,(ulong)local_48,(ulong)uVar6);
        }
      }
    }
    uVar4 = local_48 + 1;
  } while( true );
}

Assistant:

void HandleParamBlock(ParamBlock* block, bool isConfigs)
	{
		int startIdx = ntohs(block->startIdx);
		int numParams = ntohs(block->numParams);
		if (isConfigs && numParams + startIdx > m_CurrConfigs.size())
			m_CurrConfigs.resize(numParams + startIdx);
		if (!isConfigs && numParams + startIdx > m_CurrStatuses.size())
			m_CurrStatuses.resize(numParams + startIdx);

		if(s_JSONOutput)
		{
			// Header
			if(isConfigs)
				printf("\"config\": {\n");
			else
				printf("\"status\": {\n");
		}

		bool hasPrev = false;
		for (int i = startIdx; i < startIdx + numParams; ++i)
		{
			int16_t valInt = ntohs(block->payload[i - startIdx]);
			if (valInt == -21931)
				continue;
			if(isConfigs)
			{
				m_CurrConfigs[i] = valInt;
				if(s_JSONOutput)
				{
					if(hasPrev)
						printf(",\n");
					printf("\"%d\" : %d", i, valInt);
					hasPrev = true;
				}
				else
				{
					printf("/home/alsavo/config/%d={\"type\":\"config\", \"index\":%d, \"value\":%d}\n",i, i, valInt);
				}
			}
			else
			{
				m_CurrStatuses[i] = valInt;
				if(s_JSONOutput)
				{
					if(hasPrev)
						printf(",\n");
					printf("\"%d\" : ", i);
					if (m_TemperatureStatusIndices.find(i) != m_TemperatureStatusIndices.end())
					{
						float fval = ((float)valInt) / 10.0f;
						printf("%.1f", fval);
					}
					else
						printf("%d", valInt);
					
					hasPrev = true;


				}
				else
				{
					if (m_TemperatureStatusIndices.find(i) != m_TemperatureStatusIndices.end())
					{
						float fval = ((float)valInt) / 10.0f;
						printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%.1f}\n", i, i, fval);
					}
					else
						printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%d}\n", i, i, valInt);
				}
			}
		}
		if(s_JSONOutput)
		{
			printf("\n}");
			if(!isConfigs) // Status is printed out first
				printf(",");
			printf("\n");
		}

	}